

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Maybe<kj::StringPtr> * kj::consumeWord(char **ptr)

{
  byte bVar1;
  char *pcVar2;
  long lVar3;
  Maybe<kj::StringPtr> *in_RDI;
  
  for (pcVar2 = *ptr; (*pcVar2 == '\t' || (*pcVar2 == ' ')); pcVar2 = pcVar2 + 1) {
  }
  lVar3 = 1;
  do {
    bVar1 = pcVar2[lVar3 + -1];
    if (bVar1 < 10) {
      if (bVar1 == 0) {
        *ptr = pcVar2 + lVar3 + -1;
        goto LAB_0039e439;
      }
      if (bVar1 == 9) {
LAB_0039e421:
        *ptr = pcVar2 + lVar3;
        pcVar2[lVar3 + -1] = '\0';
LAB_0039e439:
        (in_RDI->ptr).isSet = true;
        (in_RDI->ptr).field_1.value.content.ptr = pcVar2;
        *(long *)((long)&(in_RDI->ptr).field_1 + 8) = lVar3;
        return in_RDI;
      }
    }
    else {
      if ((bVar1 == 10) || (bVar1 == 0xd)) {
        (in_RDI->ptr).isSet = false;
        return in_RDI;
      }
      if (bVar1 == 0x20) goto LAB_0039e421;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static kj::Maybe<kj::StringPtr> consumeWord(char*& ptr) {
  char* start = skipSpace(ptr);
  char* p = start;

  for (;;) {
    switch (*p) {
      case '\0':
        ptr = p;
        return kj::StringPtr(start, p);

      case '\t':
      case ' ': {
        char* end = p++;
        ptr = p;
        *end = '\0';
        return kj::StringPtr(start, end);
      }

      case '\n':
      case '\r':
        // Not expecting EOL!
        return kj::none;

      default:
        ++p;
        break;
    }
  }
}